

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

bool __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::operator<
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<28U,_unsigned_char,_unsigned_int,_int> *other)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  long lVar8;
  long in_FS_OFFSET;
  
  uVar3 = this->_size;
  uVar5 = uVar3 - 0x1d;
  if (uVar3 < 0x1d) {
    uVar5 = uVar3;
  }
  uVar4 = other->_size;
  uVar6 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar6 = uVar4;
  }
  bVar7 = true;
  if (uVar6 <= uVar5) {
    if (uVar5 <= uVar6) {
      if (0x1c < uVar3) {
        this = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (this->_union).indirect_contents.indirect;
      }
      if (0x1c < uVar4) {
        other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                (other->_union).indirect_contents.indirect;
      }
      for (lVar8 = 0; (int)uVar5 != lVar8; lVar8 = lVar8 + 1) {
        bVar1 = *(byte *)((long)&this->_union + lVar8);
        bVar2 = *(byte *)((long)&other->_union + lVar8);
        if (bVar1 < bVar2) goto LAB_0029cc8b;
        if (bVar2 < bVar1) break;
      }
    }
    bVar7 = false;
  }
LAB_0029cc8b:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const prevector<N, T, Size, Diff>& other) const {
        if (size() < other.size()) {
            return true;
        }
        if (size() > other.size()) {
            return false;
        }
        const_iterator b1 = begin();
        const_iterator b2 = other.begin();
        const_iterator e1 = end();
        while (b1 != e1) {
            if ((*b1) < (*b2)) {
                return true;
            }
            if ((*b2) < (*b1)) {
                return false;
            }
            ++b1;
            ++b2;
        }
        return false;
    }